

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

void __thiscall llvm::APInt::reallocate(APInt *this,uint NewBitWidth)

{
  uint64_t *puVar1;
  int iVar2;
  
  iVar2 = (int)((ulong)NewBitWidth + 0x3f >> 6);
  if ((int)((ulong)this->BitWidth + 0x3f >> 6) == iVar2) {
    this->BitWidth = NewBitWidth;
  }
  else {
    if ((0x40 < this->BitWidth) && ((this->U).pVal != (uint64_t *)0x0)) {
      operator_delete__((this->U).pVal);
    }
    this->BitWidth = NewBitWidth;
    if (0x40 < NewBitWidth) {
      puVar1 = (uint64_t *)operator_new__((ulong)(uint)(iVar2 << 3));
      (this->U).pVal = puVar1;
    }
  }
  return;
}

Assistant:

void APInt::reallocate(unsigned NewBitWidth) {
  // If the number of words is the same we can just change the width and stop.
  if (getNumWords() == getNumWords(NewBitWidth)) {
    BitWidth = NewBitWidth;
    return;
  }

  // If we have an allocation, delete it.
  if (!isSingleWord())
    delete [] U.pVal;

  // Update BitWidth.
  BitWidth = NewBitWidth;

  // If we are supposed to have an allocation, create it.
  if (!isSingleWord())
    U.pVal = getMemory(getNumWords());
}